

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_estimateCCtxSize(int compressionLevel)

{
  size_t sVar1;
  int compressionLevel_00;
  ulong uVar2;
  bool bVar3;
  ZSTD_CCtx_params cctxParams;
  ZSTD_compressionParameters local_c8;
  ZSTD_CCtx_params local_a8;
  
  if (compressionLevel < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    compressionLevel_00 = 1;
    do {
      ZSTD_getCParams(&local_c8,compressionLevel_00,0,0);
      local_a8.customMem.customAlloc = (ZSTD_allocFunction)0x0;
      local_a8.customMem.customFree = (ZSTD_freeFunction)0x0;
      local_a8.ldmParams.minMatchLength = 0;
      local_a8.ldmParams.hashEveryLog = 0;
      local_a8.ldmParams.windowLog = 0;
      local_a8._92_4_ = 0;
      local_a8.overlapSizeLog = 0;
      local_a8.ldmParams.enableLdm = 0;
      local_a8.ldmParams.hashLog = 0;
      local_a8.ldmParams.bucketSizeLog = 0;
      local_a8.disableLiteralCompression = 0;
      local_a8.forceWindow = 0;
      local_a8.nbWorkers = 0;
      local_a8.jobSize = 0;
      local_a8.format = ZSTD_f_zstd1;
      local_a8.customMem.opaque = (void *)0x0;
      local_a8.cParams.targetLength = local_c8.targetLength;
      local_a8.cParams.strategy = local_c8.strategy;
      local_a8.cParams.windowLog = local_c8.windowLog;
      local_a8.cParams.chainLog = local_c8.chainLog;
      local_a8.fParams.noDictIDFlag = 0;
      local_a8.compressionLevel = 3;
      local_a8.fParams.contentSizeFlag = 1;
      local_a8.fParams.checksumFlag = 0;
      sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams(&local_a8);
      if (uVar2 < sVar1) {
        uVar2 = sVar1;
      }
      bVar3 = compressionLevel_00 != compressionLevel;
      compressionLevel_00 = compressionLevel_00 + 1;
    } while (bVar3);
  }
  return uVar2;
}

Assistant:

size_t ZSTD_estimateCCtxSize(int compressionLevel)
{
    int level;
    size_t memBudget = 0;
    for (level=1; level<=compressionLevel; level++) {
        size_t const newMB = ZSTD_estimateCCtxSize_internal(level);
        if (newMB > memBudget) memBudget = newMB;
    }
    return memBudget;
}